

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O2

void __thiscall
DynamicGraph::dropLevel
          (DynamicGraph *this,Vertex w,list<unsigned_long,_std::allocator<unsigned_long>_> *queue,
          list<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
          *actions,list<unsigned_long,_std::allocator<unsigned_long>_> *incVertices)

{
  _Base_ptr p_Var1;
  pointer puVar2;
  pointer pRVar3;
  Vertex VVar4;
  DynamicGraph *pDVar5;
  Delete *pDVar6;
  Insert *pIVar7;
  _Base_ptr p_Var8;
  _Rb_tree_node_base *p_Var9;
  pointer pRVar10;
  _Base_ptr p_Var11;
  Vertex ww;
  Vertex w_local;
  DynamicGraph *local_60;
  _Base_ptr local_58;
  list<unsigned_long,_std::allocator<unsigned_long>_> *local_50;
  list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
  *local_48;
  Delete *local_40;
  _Base_ptr local_38;
  
  w_local = w;
  local_50 = queue;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_front
            (incVertices,&w_local);
  puVar2 = (this->level).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start + w_local;
  *puVar2 = *puVar2 + 1;
  pRVar10 = (this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
            super__Vector_impl_data._M_start;
  p_Var8 = *(_Base_ptr *)((long)&pRVar10[w_local].b_sibl._M_t._M_impl + 0x18);
  local_60 = this;
  local_48 = (list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
              *)actions;
  while( true ) {
    pDVar5 = local_60;
    if (p_Var8 == (_Base_ptr)((long)&pRVar10[w_local].b_sibl._M_t._M_impl + 8U)) break;
    p_Var1 = p_Var8 + 1;
    p_Var11 = p_Var8[1]._M_parent;
    if ((_Base_ptr)w_local == p_Var11) {
      p_Var11 = *(_Base_ptr *)p_Var1;
    }
    local_38 = p_Var8;
    pDVar6 = (Delete *)operator_new(0x28);
    local_58 = p_Var1;
    Delete::Delete(pDVar6,&pRVar10[(long)p_Var11].b_sibl,*(Edge *)p_Var1);
    actions = (list<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
               *)local_48;
    ww = (Vertex)pDVar6;
    std::__cxx11::
    list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
    ::emplace_front<Delete*>(local_48,(Delete **)&ww);
    p_Var8 = local_58;
    pDVar5 = local_60;
    std::
    _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
    ::erase(&(local_60->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl
             .super__Vector_impl_data._M_start[(long)p_Var11].b_sibl._M_t,(key_type *)local_58);
    pIVar7 = (Insert *)operator_new(0x28);
    Insert::Insert(pIVar7,&(pDVar5->relatives).
                           super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
                           super__Vector_impl_data._M_start[(long)p_Var11].c_succ,*(Edge *)p_Var8);
    ww = (Vertex)pIVar7;
    std::__cxx11::
    list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
    ::emplace_front<Insert*>
              ((list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
                *)actions,(Insert **)&ww);
    std::
    _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::less<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
    ::_M_insert_unique<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>const&>
              ((_Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::less<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
                *)&(pDVar5->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>.
                   _M_impl.super__Vector_impl_data._M_start[(long)p_Var11].c_succ,
               (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)local_58);
    p_Var8 = (_Base_ptr)std::_Rb_tree_increment(local_38);
    pRVar10 = (pDVar5->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  p_Var8 = *(_Base_ptr *)((long)&pRVar10[w_local].a_pred._M_t._M_impl + 0x18);
  while (pRVar3 = pRVar10 + w_local,
        p_Var8 != (_Rb_tree_node_base *)((long)&pRVar10[w_local].a_pred._M_t._M_impl + 8U)) {
    pDVar6 = (Delete *)operator_new(0x28);
    Delete::Delete(pDVar6,&pRVar3->a_pred,*(Edge *)(p_Var8 + 1));
    ww = (Vertex)pDVar6;
    std::__cxx11::
    list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
    ::emplace_front<Delete*>
              ((list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
                *)actions,(Delete **)&ww);
    p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    pRVar10 = (pDVar5->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  std::
  _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  ::clear((_Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
           *)pRVar3);
  pRVar10 = (pDVar5->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
            super__Vector_impl_data._M_start;
  p_Var9 = *(_Base_ptr *)((long)&pRVar10[w_local].b_sibl._M_t._M_impl + 0x18);
  while (pRVar3 = pRVar10 + w_local,
        p_Var9 != (_Rb_tree_node_base *)((long)&pRVar10[w_local].b_sibl._M_t._M_impl + 8U)) {
    pIVar7 = (Insert *)operator_new(0x28);
    Insert::Insert(pIVar7,&pRVar3->a_pred,*(Edge *)(p_Var9 + 1));
    ww = (Vertex)pIVar7;
    std::__cxx11::
    list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
    ::emplace_front<Insert*>
              ((list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
                *)actions,(Insert **)&ww);
    std::
    _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::less<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
    ::_M_insert_unique<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>const&>
              ((_Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::less<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
                *)((pDVar5->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>.
                   _M_impl.super__Vector_impl_data._M_start + w_local),
               (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)(p_Var9 + 1));
    p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
    pRVar10 = (pDVar5->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  p_Var8 = (pRVar3->c_succ)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pDVar5 = local_60, p_Var8 != (_Base_ptr)((long)&pRVar10[w_local].c_succ._M_t._M_impl + 8U))
  {
    p_Var1 = p_Var8 + 1;
    p_Var11 = p_Var8[1]._M_parent;
    if ((_Base_ptr)w_local == p_Var11) {
      p_Var11 = *(_Base_ptr *)p_Var1;
    }
    ww = (Vertex)p_Var11;
    local_58 = p_Var8;
    pDVar6 = (Delete *)operator_new(0x28);
    Delete::Delete(pDVar6,&pRVar10[(long)p_Var11].a_pred,*(Edge *)p_Var1);
    actions = (list<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
               *)local_48;
    local_40 = pDVar6;
    std::__cxx11::
    list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
    ::emplace_front<Delete*>(local_48,&local_40);
    pDVar5 = local_60;
    std::
    _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
    ::erase((_Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
             *)((local_60->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>.
                _M_impl.super__Vector_impl_data._M_start + ww),(key_type *)p_Var1);
    pIVar7 = (Insert *)operator_new(0x28);
    Insert::Insert(pIVar7,&(pDVar5->relatives).
                           super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
                           super__Vector_impl_data._M_start[ww].b_sibl,*(Edge *)p_Var1);
    local_40 = (Delete *)pIVar7;
    std::__cxx11::
    list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
    ::emplace_front<Insert*>
              ((list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
                *)actions,(Insert **)&local_40);
    std::
    _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::less<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
    ::_M_insert_unique<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>const&>
              ((_Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::less<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
                *)&(pDVar5->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>.
                   _M_impl.super__Vector_impl_data._M_start[ww].b_sibl,
               (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)p_Var1);
    pRVar10 = (pDVar5->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (*(size_t *)((long)&pRVar10[ww].a_pred._M_t._M_impl + 0x28) == 0) {
      std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back(local_50,&ww);
      pRVar10 = (pDVar5->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>.
                _M_impl.super__Vector_impl_data._M_start;
    }
    p_Var8 = (_Base_ptr)std::_Rb_tree_increment(local_58);
  }
  p_Var9 = *(_Base_ptr *)((long)&pRVar10[w_local].b_sibl._M_t._M_impl + 0x18);
  while (pRVar3 = pRVar10 + w_local,
        p_Var9 != (_Rb_tree_node_base *)((long)&pRVar10[w_local].b_sibl._M_t._M_impl + 8U)) {
    pDVar6 = (Delete *)operator_new(0x28);
    Delete::Delete(pDVar6,&pRVar3->b_sibl,*(Edge *)(p_Var9 + 1));
    ww = (Vertex)pDVar6;
    std::__cxx11::
    list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
    ::emplace_front<Delete*>
              ((list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
                *)actions,(Delete **)&ww);
    p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
    pRVar10 = (pDVar5->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  std::
  _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  ::clear(&(pRVar3->b_sibl)._M_t);
  pRVar10 = (pDVar5->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
            super__Vector_impl_data._M_start;
  p_Var8 = *(_Base_ptr *)((long)&pRVar10[w_local].c_succ._M_t._M_impl + 0x18);
  while (VVar4 = w_local,
        p_Var8 != (_Rb_tree_node_base *)((long)&pRVar10[w_local].c_succ._M_t._M_impl + 8U)) {
    pIVar7 = (Insert *)operator_new(0x28);
    Insert::Insert(pIVar7,&pRVar10[VVar4].b_sibl,*(Edge *)(p_Var8 + 1));
    ww = (Vertex)pIVar7;
    std::__cxx11::
    list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
    ::emplace_front<Insert*>
              ((list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
                *)actions,(Insert **)&ww);
    std::
    _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::less<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
    ::_M_insert_unique<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>const&>
              ((_Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::less<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
                *)&(pDVar5->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>.
                   _M_impl.super__Vector_impl_data._M_start[w_local].b_sibl,
               (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)(p_Var8 + 1));
    p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    pRVar10 = (pDVar5->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  p_Var8 = *(_Base_ptr *)((long)&pRVar10[w_local].c_succ._M_t._M_impl + 0x18);
  while (pRVar3 = pRVar10 + w_local,
        p_Var8 != (_Rb_tree_node_base *)((long)&pRVar10[w_local].c_succ._M_t._M_impl + 8U)) {
    pDVar6 = (Delete *)operator_new(0x28);
    Delete::Delete(pDVar6,&pRVar3->c_succ,*(Edge *)(p_Var8 + 1));
    ww = (Vertex)pDVar6;
    std::__cxx11::
    list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
    ::emplace_front<Delete*>
              ((list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
                *)actions,(Delete **)&ww);
    p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    pRVar10 = (pDVar5->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  std::
  _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  ::clear(&(pRVar3->c_succ)._M_t);
  if (*(size_t *)
       ((long)&(pDVar5->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl
               .super__Vector_impl_data._M_start[w_local].a_pred._M_t._M_impl + 0x28) == 0) {
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back(local_50,&w_local);
  }
  return;
}

Assistant:

void DynamicGraph::dropLevel(Vertex w, std::list<Vertex> &queue,
                             std::list<std::unique_ptr<Action>> &actions, std::list<Vertex> &incVertices)
{
    // Remove w from its level (say, Lj), and put it in the next level (Lj+1)
    incVertices.push_front(w);
    level[w]++;

    // For each edge e (w---w') in b_sibl(w)
    for(auto ei = relatives[w].b_sibl.begin(); ei != relatives[w].b_sibl.end(); ++ei) {
        Vertex ww = (w==target(*ei, *this)) ? source(*ei, *this) : target(*ei, *this);
        // remove e from b_sibl(w')
        actions.emplace_front(new Delete(relatives[ww].b_sibl, *ei));
        relatives[ww].b_sibl.erase(*ei);
        // and put it in c_succ(w')
        actions.emplace_front(new Insert(relatives[ww].c_succ, *ei));
        relatives[ww].c_succ.insert(*ei);
    }

    // a_pred(w) <- b_pred(w)
    for(auto ei = relatives[w].a_pred.begin(); ei != relatives[w].a_pred.end(); ++ei) {
        actions.emplace_front(new Delete(relatives[w].a_pred, *ei));
    }
    relatives[w].a_pred.clear();
    for(auto ei = relatives[w].b_sibl.begin(); ei != relatives[w].b_sibl.end(); ++ei) {
        actions.emplace_front(new Insert(relatives[w].a_pred, *ei));
        relatives[w].a_pred.insert(*ei);
    }

    // For each edge e (w---w') in c_succ(w)
    for(auto ei = relatives[w].c_succ.begin(); ei != relatives[w].c_succ.end(); ++ei) {
        Vertex ww = (w==target(*ei, *this)) ? source(*ei, *this) : target(*ei, *this);
        // remove e from a_pred(w')
        actions.emplace_front(new Delete(relatives[ww].a_pred, *ei));
        relatives[ww].a_pred.erase(*ei);
        // and put it in b_sibl(w');
        actions.emplace_front(new Insert(relatives[ww].b_sibl, *ei));
        relatives[ww].b_sibl.insert(*ei);
        // if the new a_pred(w') is empty, put w' on Q.
        if(relatives[ww].a_pred.empty()) {
            queue.push_back(ww);
        }
    }

    // b_sibl(w) <- c_succ(w)
    for(auto ei = relatives[w].b_sibl.begin(); ei != relatives[w].b_sibl.end(); ++ei) {
        actions.emplace_front(new Delete(relatives[w].b_sibl, *ei));
    }
    relatives[w].b_sibl.clear();
    for(auto ei = relatives[w].c_succ.begin(); ei != relatives[w].c_succ.end(); ++ei) {
        actions.emplace_front(new Insert(relatives[w].b_sibl, *ei));
        relatives[w].b_sibl.insert(*ei);
    }

    // c_succ(w) <- {empty}
    for(auto ei = relatives[w].c_succ.begin(); ei != relatives[w].c_succ.end(); ++ei) {
        actions.emplace_front(new Delete(relatives[w].c_succ, *ei));
    }
    relatives[w].c_succ.clear();

    // If a_pred(w) is empty, put w on Q.
    if(relatives[w].a_pred.empty()) {
        queue.push_back(w);
    }
}